

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O3

exr_result_t
hufBuildDecTable(exr_const_context_t pctxt,uint64_t *hcode,uint32_t im,uint32_t iM,HufDec *hdecod)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  code *pcVar7;
  ulong uVar8;
  HufDec *pHVar9;
  ulong uVar10;
  uint32_t *p;
  exr_memory_free_func_t local_40;
  
  if (pctxt == (exr_const_context_t)0x0) {
    local_40 = internal_exr_free;
    pcVar7 = internal_exr_alloc;
  }
  else {
    pcVar7 = pctxt->alloc_fn;
    local_40 = pctxt->free_fn;
  }
  if (im <= iM) {
    uVar10 = (ulong)im;
    do {
      uVar4 = hcode[uVar10];
      uVar8 = uVar4 >> 6;
      if (uVar8 >> ((byte)uVar4 & 0x3f) != 0) {
        return 0x17;
      }
      uVar5 = (uint)uVar4 & 0x3f;
      if (uVar5 < 0xf) {
        if ((uVar4 & 0x3f) != 0) {
          bVar3 = 0xe - (char)uVar5;
          pHVar9 = hdecod + (uVar8 << (bVar3 & 0x3f));
          lVar6 = 1L << (bVar3 & 0x3f);
          do {
            if (pHVar9->len != 0) {
              return 0x17;
            }
            if (pHVar9->p != (uint32_t *)0x0) {
              return 0x17;
            }
            pHVar9->len = uVar5;
            pHVar9->lit = (uint32_t)uVar10;
            pHVar9 = pHVar9 + 1;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
      }
      else {
        uVar8 = uVar8 >> ((char)uVar5 - 0xeU & 0x3f);
        if (hdecod[uVar8].len != 0) {
          return 0x17;
        }
        uVar5 = hdecod[uVar8].lit + 1;
        hdecod[uVar8].lit = uVar5;
        puVar2 = hdecod[uVar8].p;
        if (puVar2 == (uint32_t *)0x0) {
          puVar2 = (uint32_t *)(*pcVar7)(4);
          hdecod[uVar8].p = puVar2;
        }
        else {
          puVar1 = (uint32_t *)(*pcVar7)((ulong)uVar5 << 2);
          hdecod[uVar8].p = puVar1;
          if ((puVar1 != (uint32_t *)0x0) && (hdecod[uVar8].lit != 1)) {
            uVar4 = 0;
            do {
              puVar1[uVar4] = puVar2[uVar4];
              uVar4 = uVar4 + 1;
            } while (uVar4 < hdecod[uVar8].lit - 1);
          }
          (*local_40)(puVar2);
          puVar2 = hdecod[uVar8].p;
        }
        if (puVar2 == (uint32_t *)0x0) {
          return 1;
        }
        puVar2[hdecod[uVar8].lit - 1] = (uint32_t)uVar10;
      }
      uVar10 = uVar10 + 1;
    } while (iM + 1 != (int)uVar10);
  }
  return 0;
}

Assistant:

static exr_result_t
hufBuildDecTable (
    exr_const_context_t pctxt,
    const uint64_t*     hcode,
    uint32_t            im,
    uint32_t            iM,
    HufDec*             hdecod)
{
    void* (*alloc_fn) (size_t) = pctxt ? pctxt->alloc_fn : internal_exr_alloc;
    void (*free_fn) (void*)    = pctxt ? pctxt->free_fn : internal_exr_free;

    //
    // Init hashtable & loop on all codes.
    // Assumes that hufClearDecTable(hdecod) has already been called.
    //

    for (; im <= iM; im++)
    {
        uint64_t c = hufCode (hcode[im]);
        int      l = hufLength (hcode[im]);

        if (c >> l)
        {
            //
            // Error: c is supposed to be an l-bit code,
            // but c contains a value that is greater
            // than the largest l-bit number.
            //

            return EXR_ERR_CORRUPT_CHUNK;
        }

        if (l > HUF_DECBITS)
        {
            //
            // Long code: add a secondary entry
            //

            HufDec* pl = hdecod + (c >> (l - HUF_DECBITS));

            if (pl->len)
            {
                //
                // Error: a short code has already
                // been stored in table entry *pl.
                //

                return EXR_ERR_CORRUPT_CHUNK;
            }

            pl->lit++;

            if (pl->p)
            {
                uint32_t* p = pl->p;
                pl->p = (uint32_t*) alloc_fn (sizeof (uint32_t) * pl->lit);

                if (pl->p)
                {
                    for (uint32_t i = 0; i < pl->lit - 1; ++i)
                        pl->p[i] = p[i];
                }

                free_fn (p);
            }
            else { pl->p = (uint32_t*) alloc_fn (sizeof (uint32_t)); }

            if (!pl->p) return EXR_ERR_OUT_OF_MEMORY;

            pl->p[pl->lit - 1] = im;
        }
        else if (l)
        {
            //
            // Short code: init all primary entries
            //

            HufDec* pl = hdecod + (c << (HUF_DECBITS - l));

            for (uint64_t i = ((uint64_t) 1) << (HUF_DECBITS - l); i > 0;
                 i--, pl++)
            {
                if (pl->len || pl->p)
                {
                    //
                    // Error: a short code or a long code has
                    // already been stored in table entry *pl.
                    //

                    return EXR_ERR_CORRUPT_CHUNK;
                }

                pl->len = (int32_t) l;
                pl->lit = im;
            }
        }
    }
    return EXR_ERR_SUCCESS;
}